

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetMaxNonlinIters(void *cvode_mem,int maxcor)

{
  long in_RDI;
  CVodeMem cv_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetMaxNonlinIters","cvode_mem = NULL illegal.")
    ;
    local_4 = -0x15;
  }
  else if (*(long *)(in_RDI + 0x3c8) == 0) {
    cvProcessError((CVodeMem)0x0,-0x14,"CVODE","CVodeSetMaxNonlinIters","A memory request failed.");
    local_4 = -0x14;
  }
  else {
    local_4 = SUNNonlinSolSetMaxIters(in_stack_ffffffffffffffd8,0);
  }
  return local_4;
}

Assistant:

int CVodeSetMaxNonlinIters(void *cvode_mem, int maxcor)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMaxNonlinIters", MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->NLS == NULL) {
    cvProcessError(NULL, CV_MEM_FAIL, "CVODE", "CVodeSetMaxNonlinIters", MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  return(SUNNonlinSolSetMaxIters(cv_mem->NLS, maxcor));
}